

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

char * __thiscall FArchive::ReadName(FArchive *this)

{
  uint start;
  byte bVar1;
  DWORD count;
  uint uVar2;
  DWORD count_1;
  char *pcVar3;
  int ofs;
  BYTE in;
  BYTE in_1;
  BYTE id;
  byte local_2b;
  byte local_2a;
  char local_29;
  
  (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,&local_29,1);
  pcVar3 = (char *)0x0;
  if (local_29 == '\x1b') {
    bVar1 = 0;
    do {
      (*this->_vptr_FArchive[3])(this,&local_2a,1);
      uVar2 = (uint)pcVar3 | (local_2a & 0x7f) << (bVar1 & 0x1f);
      pcVar3 = (char *)(ulong)uVar2;
      bVar1 = bVar1 + 7;
    } while ((char)local_2a < '\0');
    TArray<char,_char>::Grow(&this->m_NameStorage,uVar2);
    start = (this->m_NameStorage).Count;
    (this->m_NameStorage).Count = start + uVar2;
    pcVar3 = (this->m_NameStorage).Array + start;
    (*this->_vptr_FArchive[3])(this,pcVar3,(ulong)(uVar2 - 1));
    pcVar3[uVar2 - 1] = '\0';
    AddName(this,start);
  }
  else if (local_29 != '!') {
    if (local_29 == '\x1c') {
      uVar2 = 0;
      bVar1 = 0;
      do {
        (*this->_vptr_FArchive[3])(this,&local_2b,1);
        uVar2 = uVar2 | (local_2b & 0x7f) << (bVar1 & 0x1f);
        bVar1 = bVar1 + 7;
      } while ((char)local_2b < '\0');
      if ((this->m_Names).Count <= uVar2) {
        I_Error("Name %u has not been read yet\n",(ulong)uVar2);
      }
      pcVar3 = (this->m_NameStorage).Array + (this->m_Names).Array[uVar2].StringStart;
    }
    else {
      pcVar3 = (char *)0x0;
      I_Error("Expected a name but got something else\n");
    }
  }
  return pcVar3;
}

Assistant:

const char *FArchive::ReadName ()
{
	BYTE id;

	operator<< (id);
	if (id == NIL_NAME)
	{
		return NULL;
	}
	else if (id == OLD_NAME)
	{
		DWORD index = ReadCount ();
		if (index >= m_Names.Size())
		{
			I_Error ("Name %u has not been read yet\n", index);
		}
		return &m_NameStorage[m_Names[index].StringStart];
	}
	else if (id == NEW_NAME)
	{
		DWORD index;
		DWORD size = ReadCount ();
		char *str;

		index = (DWORD)m_NameStorage.Reserve (size);
		str = &m_NameStorage[index];
		Read (str, size-1);
		str[size-1] = 0;
		AddName (index);
		return str;
	}
	else
	{
		I_Error ("Expected a name but got something else\n");
		return NULL;
	}
}